

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLReader.cpp
# Opt level: O1

XMLSize_t __thiscall
xercesc_4_0::XMLReader::xcodeMoreChars
          (XMLReader *this,XMLCh *bufToFill,uchar *charSizes,XMLSize_t maxChars)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  ulong uVar5;
  XMLSize_t bytesEaten;
  long local_48;
  uchar *local_40;
  XMLSize_t local_38;
  XMLSize_t XVar4;
  
  local_48 = 0;
  XVar4 = 0;
  bVar2 = false;
  local_40 = charSizes;
  local_38 = maxChars;
  do {
    if (local_48 != 0) {
      return XVar4;
    }
    uVar5 = this->fRawBytesAvail - this->fRawBufIndex;
    if (((bVar2) || (this->fRawBytesAvail == this->fRawBufIndex)) || (uVar5 < this->fLowWaterMark))
    {
      refreshRawBuffer(this);
      if ((this->fRawBytesAvail != 0) &&
         ((!bVar2 || (uVar5 != this->fRawBytesAvail - this->fRawBufIndex)))) goto LAB_002c5098;
      bVar1 = false;
    }
    else {
LAB_002c5098:
      iVar3 = (*this->fTranscoder->_vptr_XMLTranscoder[2])
                        (this->fTranscoder,this->fRawByteBuf + this->fRawBufIndex,
                         this->fRawBytesAvail - this->fRawBufIndex,bufToFill,local_38,&local_48,
                         local_40);
      XVar4 = CONCAT44(extraout_var,iVar3);
      bVar1 = true;
      if (local_48 == 0) {
        bVar2 = true;
      }
      else {
        this->fRawBufIndex = this->fRawBufIndex + local_48;
      }
    }
    if (!bVar1) {
      return 0;
    }
  } while( true );
}

Assistant:

XMLSize_t
XMLReader::xcodeMoreChars(          XMLCh* const            bufToFill
                            ,       unsigned char* const    charSizes
                            , const XMLSize_t               maxChars)
{
    XMLSize_t charsDone = 0;
    XMLSize_t bytesEaten = 0;
    bool needMode = false;

    while (!bytesEaten)
    {
        // If our raw buffer is low, then lets load up another batch of
        // raw bytes now.
        //
        XMLSize_t bytesLeft = fRawBytesAvail - fRawBufIndex;
        if (needMode || bytesLeft == 0 || bytesLeft < fLowWaterMark)
        {
            refreshRawBuffer();

            // If there are no characters or if we need more but didn't get
            // any, return zero now.
            //
            if (fRawBytesAvail == 0 ||
                (needMode && (bytesLeft == fRawBytesAvail - fRawBufIndex)))
                return 0;
        }

        // Ask the transcoder to internalize another batch of chars. It is
        // possible that there is data in the raw buffer but the transcoder
        // is unable to produce anything because transcoding of multi-byte
        // encodings may have left a few bytes representing a partial
        // character in the buffer that can't be used until the next chunk
        // (and the rest of the character) is read. In this case set the
        // needMore flag and try again.
        //

        charsDone = fTranscoder->transcodeFrom
          (
            &fRawByteBuf[fRawBufIndex]
            , fRawBytesAvail - fRawBufIndex
            , bufToFill
            , maxChars
            , bytesEaten
            , charSizes
          );

        if (bytesEaten == 0)
            needMode = true;
        else
            fRawBufIndex += bytesEaten;
    }

    return charsDone;
}